

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O3

void plutovg_color_init_rgba(plutovg_color_t *color,float r,float g,float b,float a)

{
  undefined1 auVar1 [16];
  
  auVar1._4_4_ = g;
  auVar1._0_4_ = r;
  auVar1._8_4_ = b;
  auVar1._12_4_ = a;
  auVar1 = minps(_DAT_00122800,auVar1);
  color->r = (float)(-(uint)(0.0 <= r) & auVar1._0_4_);
  color->g = (float)(-(uint)(0.0 <= g) & auVar1._4_4_);
  color->b = (float)(-(uint)(0.0 <= b) & auVar1._8_4_);
  color->a = (float)(-(uint)(0.0 <= a) & auVar1._12_4_);
  return;
}

Assistant:

void plutovg_color_init_rgba(plutovg_color_t* color, float r, float g, float b, float a)
{
    color->r = plutovg_clamp(r, 0.f, 1.f);
    color->g = plutovg_clamp(g, 0.f, 1.f);
    color->b = plutovg_clamp(b, 0.f, 1.f);
    color->a = plutovg_clamp(a, 0.f, 1.f);
}